

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglBufferAgeTests.cpp
# Opt level: O0

IterateResult __thiscall deqp::egl::anon_unknown_0::BufferAgeTest::iterate(BufferAgeTest *this)

{
  TestContext *pTVar1;
  NativeWindow *pNVar2;
  ReferenceRenderer *this_00;
  bool bVar3;
  EGLint width_00;
  EGLint height_00;
  deUint32 dVar4;
  deBool dVar5;
  Library *egl_00;
  TestLog *log_00;
  ostream *poVar6;
  char *pcVar7;
  reference piVar8;
  reference frame;
  float x_;
  float y_;
  float z_;
  Vector<int,_2> local_4a8;
  Vector<int,_2> local_4a0;
  Vector<int,_2> local_498;
  Vector<int,_2> local_490;
  int *local_488;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_480;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_478;
  const_iterator it;
  vector<int,_std::allocator<int>_> framesOnBuffer;
  Vector<int,_2> local_450;
  Vector<int,_2> local_448;
  Vector<int,_2> local_440;
  string local_438 [32];
  undefined1 local_418 [8];
  ostringstream stream_1;
  string local_298 [32];
  undefined1 local_278 [8];
  ostringstream stream;
  undefined1 local_f8 [4];
  EGLint currentBufferAge;
  Frame newFrame;
  Surface refBuffer;
  Surface currentBuffer;
  undefined1 local_a0 [4];
  int frameNdx;
  vector<int,_std::allocator<int>_> bufferAges;
  FrameSequence frameSequence;
  int numFrames;
  Vec4 clearColor;
  float clearBlue;
  float clearGreen;
  float clearRed;
  int height;
  int width;
  TestLog *log;
  Library *egl;
  Random rnd;
  BufferAgeTest *this_local;
  
  rnd.m_rnd._8_8_ = this;
  de::Random::Random((Random *)&egl,this->m_seed);
  egl_00 = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  log_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  width_00 = eglu::querySurfaceInt(egl_00,this->m_eglDisplay,this->m_eglSurface,0x3057);
  height_00 = eglu::querySurfaceInt(egl_00,this->m_eglDisplay,this->m_eglSurface,0x3056);
  x_ = de::Random::getFloat((Random *)&egl);
  y_ = de::Random::getFloat((Random *)&egl);
  z_ = de::Random::getFloat((Random *)&egl);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)
             ((long)&frameSequence.
                     super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),x_,y_,z_,1.0);
  frameSequence.
  super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0x14;
  std::
  vector<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
  ::vector((vector<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
            *)&bufferAges.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_a0);
  if ((this->m_preserveColorBuffer & 1U) == 0) {
    do {
      (*egl_00->_vptr_Library[0x30])(egl_00,this->m_eglDisplay,this->m_eglSurface,0x3093,0x3095);
      dVar4 = (*egl_00->_vptr_Library[0x1f])();
      eglu::checkError(dVar4,
                       "surfaceAttrib(m_eglDisplay, m_eglSurface, EGL_SWAP_BEHAVIOR, EGL_BUFFER_DESTROYED)"
                       ,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglBufferAgeTests.cpp"
                       ,0x1f5);
      dVar5 = ::deGetFalse();
    } while (dVar5 != 0);
  }
  else {
    do {
      (*egl_00->_vptr_Library[0x30])(egl_00,this->m_eglDisplay,this->m_eglSurface,0x3093,0x3094);
      dVar4 = (*egl_00->_vptr_Library[0x1f])();
      eglu::checkError(dVar4,
                       "surfaceAttrib(m_eglDisplay, m_eglSurface, EGL_SWAP_BEHAVIOR, EGL_BUFFER_PRESERVED)"
                       ,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglBufferAgeTests.cpp"
                       ,499);
      dVar5 = ::deGetFalse();
    } while (dVar5 != 0);
  }
  for (currentBuffer.m_pixels.m_cap._4_4_ = 0; currentBuffer.m_pixels.m_cap._4_4_ < 0x14;
      currentBuffer.m_pixels.m_cap._4_4_ = currentBuffer.m_pixels.m_cap._4_4_ + 1) {
    tcu::Surface::Surface((Surface *)&refBuffer.m_pixels.m_cap,width_00,height_00);
    tcu::Surface::Surface
              ((Surface *)
               &newFrame.draws.
                super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,width_00,height_00);
    Frame::Frame((Frame *)local_f8,width_00,height_00);
    stream._372_4_ = 0xffffffff;
    if (currentBuffer.m_pixels.m_cap._4_4_ % 2 == 0) {
      generateRandomFrame((Frame *)local_f8,&this->m_evenFrameDrawType,(Random *)&egl);
    }
    else {
      generateRandomFrame((Frame *)local_f8,&this->m_oddFrameDrawType,(Random *)&egl);
    }
    std::
    vector<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
    ::push_back((vector<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
                 *)&bufferAges.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,(value_type *)local_f8);
    do {
      (*egl_00->_vptr_Library[0x2b])
                (egl_00,this->m_eglDisplay,this->m_eglSurface,0x313d,&stream.field_0x174);
      dVar4 = (*egl_00->_vptr_Library[0x1f])();
      eglu::checkError(dVar4,
                       "querySurface(m_eglDisplay, m_eglSurface, EGL_BUFFER_AGE_EXT, &currentBufferAge)"
                       ,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglBufferAgeTests.cpp"
                       ,0x205);
      dVar5 = ::deGetFalse();
    } while (dVar5 != 0);
    if ((currentBuffer.m_pixels.m_cap._4_4_ < (int)stream._372_4_) || ((int)stream._372_4_ < 0)) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_278);
      poVar6 = std::operator<<((ostream *)local_278,"Fail, the age is invalid. Age: ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,stream._372_4_);
      poVar6 = std::operator<<(poVar6,", frameNdx: ");
      std::ostream::operator<<(poVar6,currentBuffer.m_pixels.m_cap._4_4_);
      pTVar1 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
      std::__cxx11::ostringstream::str();
      pcVar7 = (char *)std::__cxx11::string::c_str();
      tcu::TestContext::setTestResult(pTVar1,QP_TEST_RESULT_FAIL,pcVar7);
      std::__cxx11::string::~string(local_298);
      this_local._4_4_ = STOP;
      stream_1._372_4_ = 1;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_278);
    }
    else if (((currentBuffer.m_pixels.m_cap._4_4_ < 1) || ((this->m_preserveColorBuffer & 1U) == 0))
            || (stream._372_4_ == 1)) {
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)local_a0,
                 (value_type_conflict1 *)&stream.field_0x174);
      if (currentBuffer.m_pixels.m_cap._4_4_ < 10) {
        if (stream._372_4_ == 0) {
          clearColorScreen(&this->m_gl,
                           (Vec4 *)((long)&frameSequence.
                                           super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
        }
        GLES2Renderer::render(this->m_gles2Renderer,width_00,height_00,(Frame *)local_f8);
        if (this->m_resizeType == RESIZETYPE_BEFORE_SWAP) {
          if (currentBuffer.m_pixels.m_cap._4_4_ % 2 == 0) {
            pNVar2 = this->m_window;
            tcu::Vector<int,_2>::Vector(&local_440,width_00 * 2,height_00 / 2);
            (*pNVar2->_vptr_NativeWindow[6])(pNVar2,&local_440);
          }
          else {
            pNVar2 = this->m_window;
            tcu::Vector<int,_2>::Vector(&local_448,height_00 / 2,width_00 * 2);
            (*pNVar2->_vptr_NativeWindow[6])(pNVar2,&local_448);
          }
        }
        do {
          (*egl_00->_vptr_Library[0x31])(egl_00,this->m_eglDisplay,this->m_eglSurface);
          dVar4 = (*egl_00->_vptr_Library[0x1f])();
          eglu::checkError(dVar4,"swapBuffers(m_eglDisplay, m_eglSurface)",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglBufferAgeTests.cpp"
                           ,0x22a);
          dVar5 = ::deGetFalse();
        } while (dVar5 != 0);
        if (this->m_resizeType == RESIZETYPE_AFTER_SWAP) {
          if (currentBuffer.m_pixels.m_cap._4_4_ % 2 == 0) {
            pNVar2 = this->m_window;
            tcu::Vector<int,_2>::Vector(&local_450,width_00 * 2,height_00 / 2);
            (*pNVar2->_vptr_NativeWindow[6])();
          }
          else {
            pNVar2 = this->m_window;
            tcu::Vector<int,_2>::Vector
                      ((Vector<int,_2> *)
                       &framesOnBuffer.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,height_00 / 2,width_00 * 2);
            (*pNVar2->_vptr_NativeWindow[6])();
          }
        }
        stream_1._372_4_ = 8;
      }
      else {
        if ((int)stream._372_4_ < 1) {
          clearColorScreen(&this->m_gl,
                           (Vec4 *)((long)&frameSequence.
                                           super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
          clearColorReference((Surface *)
                              &newFrame.draws.
                               super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              (Vec4 *)((long)&frameSequence.
                                              super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 4
                                      ));
        }
        else {
          getFramesOnBuffer((vector<int,_std::allocator<int>_> *)&it,
                            (vector<int,_std::allocator<int>_> *)local_a0,
                            currentBuffer.m_pixels.m_cap._4_4_);
          anon_unknown_0::readPixels(&this->m_gl,(Surface *)&refBuffer.m_pixels.m_cap);
          clearColorReference((Surface *)
                              &newFrame.draws.
                               super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              (Vec4 *)((long)&frameSequence.
                                              super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 4
                                      ));
          local_478._M_current =
               (int *)std::vector<int,_std::allocator<int>_>::begin
                                ((vector<int,_std::allocator<int>_> *)&it);
          while( true ) {
            local_480._M_current =
                 (int *)std::vector<int,_std::allocator<int>_>::end
                                  ((vector<int,_std::allocator<int>_> *)&it);
            bVar3 = __gnu_cxx::operator!=(&local_478,&local_480);
            if (!bVar3) break;
            this_00 = this->m_refRenderer;
            piVar8 = __gnu_cxx::
                     __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                     operator*(&local_478);
            frame = std::
                    vector<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
                    ::operator[]((vector<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
                                  *)&bufferAges.super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage,(long)*piVar8
                                );
            ReferenceRenderer::render
                      (this_00,(Surface *)
                               &newFrame.draws.
                                super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,frame);
            local_488 = (int *)__gnu_cxx::
                               __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                               ::operator++(&local_478,0);
          }
          bVar3 = compareToReference(log_00,(Surface *)
                                            &newFrame.draws.
                                             super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                     (Surface *)&refBuffer.m_pixels.m_cap,
                                     currentBuffer.m_pixels.m_cap._4_4_,
                                     currentBuffer.m_pixels.m_cap._4_4_ - stream._372_4_);
          if (!bVar3) {
            tcu::TestContext::setTestResult
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                       QP_TEST_RESULT_FAIL,"Fail, buffer content is not well preserved when age > 0"
                      );
            this_local._4_4_ = STOP;
          }
          stream_1._373_3_ = 0;
          stream_1._372_1_ = !bVar3;
          std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&it);
          if (stream_1._372_4_ != 0) goto LAB_017cf3af;
        }
        GLES2Renderer::render(this->m_gles2Renderer,width_00,height_00,(Frame *)local_f8);
        ReferenceRenderer::render
                  (this->m_refRenderer,
                   (Surface *)
                   &newFrame.draws.
                    super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(Frame *)local_f8);
        anon_unknown_0::readPixels(&this->m_gl,(Surface *)&refBuffer.m_pixels.m_cap);
        bVar3 = compareToReference(log_00,(Surface *)
                                          &newFrame.draws.
                                           super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                   (Surface *)&refBuffer.m_pixels.m_cap,
                                   currentBuffer.m_pixels.m_cap._4_4_,
                                   currentBuffer.m_pixels.m_cap._4_4_);
        if (bVar3) {
          if (this->m_resizeType == RESIZETYPE_BEFORE_SWAP) {
            if (currentBuffer.m_pixels.m_cap._4_4_ % 2 == 0) {
              pNVar2 = this->m_window;
              tcu::Vector<int,_2>::Vector(&local_490,width_00 * 2,height_00 / 2);
              (*pNVar2->_vptr_NativeWindow[6])(pNVar2,&local_490);
            }
            else {
              pNVar2 = this->m_window;
              tcu::Vector<int,_2>::Vector(&local_498,height_00 / 2,width_00 * 2);
              (*pNVar2->_vptr_NativeWindow[6])(pNVar2,&local_498);
            }
          }
          do {
            (*egl_00->_vptr_Library[0x31])(egl_00,this->m_eglDisplay,this->m_eglSurface);
            dVar4 = (*egl_00->_vptr_Library[0x1f])();
            eglu::checkError(dVar4,"swapBuffers(m_eglDisplay, m_eglSurface)",
                             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglBufferAgeTests.cpp"
                             ,0x260);
            dVar5 = ::deGetFalse();
          } while (dVar5 != 0);
          if (this->m_resizeType == RESIZETYPE_AFTER_SWAP) {
            if (currentBuffer.m_pixels.m_cap._4_4_ % 2 == 0) {
              pNVar2 = this->m_window;
              tcu::Vector<int,_2>::Vector(&local_4a0,width_00 * 2,height_00 / 2);
              (*pNVar2->_vptr_NativeWindow[6])();
            }
            else {
              pNVar2 = this->m_window;
              tcu::Vector<int,_2>::Vector(&local_4a8,height_00 / 2,width_00 * 2);
              (*pNVar2->_vptr_NativeWindow[6])();
            }
          }
          stream_1._372_4_ = 0;
        }
        else {
          tcu::TestContext::setTestResult
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                     QP_TEST_RESULT_FAIL,"Fail, render result is wrong");
          this_local._4_4_ = STOP;
          stream_1._372_4_ = 1;
        }
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_418);
      poVar6 = std::operator<<((ostream *)local_418,
                               "Fail, EGL_BUFFER_PRESERVED is set to true, but buffer age is: ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,stream._372_4_);
      std::operator<<(poVar6," (should be 1)");
      pTVar1 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
      std::__cxx11::ostringstream::str();
      pcVar7 = (char *)std::__cxx11::string::c_str();
      tcu::TestContext::setTestResult(pTVar1,QP_TEST_RESULT_FAIL,pcVar7);
      std::__cxx11::string::~string(local_438);
      this_local._4_4_ = STOP;
      stream_1._372_4_ = 1;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_418);
    }
LAB_017cf3af:
    Frame::~Frame((Frame *)local_f8);
    tcu::Surface::~Surface
              ((Surface *)
               &newFrame.draws.
                super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    tcu::Surface::~Surface((Surface *)&refBuffer.m_pixels.m_cap);
    if ((stream_1._372_4_ != 0) && (stream_1._372_4_ != 8)) goto LAB_017cf45a;
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  this_local._4_4_ = STOP;
  stream_1._372_4_ = 1;
LAB_017cf45a:
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_a0);
  std::
  vector<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
  ::~vector((vector<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
             *)&bufferAges.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  de::Random::~Random((Random *)&egl);
  return this_local._4_4_;
}

Assistant:

TestCase::IterateResult BufferAgeTest::iterate (void)
{
	de::Random		rnd					(m_seed);
	const Library&	egl					= m_eglTestCtx.getLibrary();
	tcu::TestLog&	log					= m_testCtx.getLog();
	const int		width				= eglu::querySurfaceInt(egl, m_eglDisplay, m_eglSurface, EGL_WIDTH);
	const int		height				= eglu::querySurfaceInt(egl, m_eglDisplay, m_eglSurface, EGL_HEIGHT);
	const float		clearRed			= rnd.getFloat();
	const float		clearGreen			= rnd.getFloat();
	const float		clearBlue			= rnd.getFloat();
	const tcu::Vec4	clearColor			(clearRed, clearGreen, clearBlue, 1.0f);
	const int		numFrames			= 20;
	FrameSequence	frameSequence;
	vector<int>		bufferAges;

	if (m_preserveColorBuffer)
		EGLU_CHECK_CALL(egl, surfaceAttrib(m_eglDisplay, m_eglSurface, EGL_SWAP_BEHAVIOR, EGL_BUFFER_PRESERVED));
	else
		EGLU_CHECK_CALL(egl, surfaceAttrib(m_eglDisplay, m_eglSurface, EGL_SWAP_BEHAVIOR, EGL_BUFFER_DESTROYED));

	for (int frameNdx = 0; frameNdx < numFrames; frameNdx++)
	{
		tcu::Surface					currentBuffer			(width, height);
		tcu::Surface					refBuffer				(width, height);
		Frame							newFrame				(width, height);
		EGLint							currentBufferAge		= -1;

		if (frameNdx % 2 == 0)
			generateRandomFrame(&newFrame, m_evenFrameDrawType, rnd);
		else
			generateRandomFrame(&newFrame, m_oddFrameDrawType, rnd);

		frameSequence.push_back(newFrame);

		EGLU_CHECK_CALL(egl, querySurface(m_eglDisplay, m_eglSurface, EGL_BUFFER_AGE_EXT, &currentBufferAge));

		if (currentBufferAge > frameNdx || currentBufferAge < 0) // invalid buffer age
		{
			std::ostringstream stream;
			stream << "Fail, the age is invalid. Age: " << currentBufferAge << ", frameNdx: " << frameNdx;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, stream.str().c_str());
			return STOP;
		}

		if (frameNdx > 0 && m_preserveColorBuffer && currentBufferAge != 1)
		{
			std::ostringstream stream;
			stream << "Fail, EGL_BUFFER_PRESERVED is set to true, but buffer age is: " << currentBufferAge << " (should be 1)";
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, stream.str().c_str());
			return STOP;
		}

		bufferAges.push_back(currentBufferAge);
		DE_ASSERT((int)bufferAges.size() == frameNdx+1);

		// during first half, just keep rendering without reading pixel back to mimic ordinary use case
		if (frameNdx < numFrames/2)
		{
			if (currentBufferAge == 0)
				clearColorScreen(m_gl, clearColor);

			m_gles2Renderer->render(width, height, newFrame);

			if (m_resizeType == RESIZETYPE_BEFORE_SWAP)
			{
				if (frameNdx % 2 == 0)
					m_window->setSurfaceSize(IVec2(width*2, height/2));
				else
					m_window->setSurfaceSize(IVec2(height/2, width*2));
			}

			EGLU_CHECK_CALL(egl, swapBuffers(m_eglDisplay, m_eglSurface));

			if (m_resizeType == RESIZETYPE_AFTER_SWAP)
			{
				if (frameNdx % 2 == 0)
					m_window->setSurfaceSize(IVec2(width*2, height/2));
				else
					m_window->setSurfaceSize(IVec2(height/2, width*2));
			}

			continue;
		}

		// do verification in the second half
		if (currentBufferAge > 0) //buffer contain previous content, need to verify
		{
			const vector<int> framesOnBuffer = getFramesOnBuffer(bufferAges, frameNdx);
			readPixels(m_gl, &currentBuffer);
			clearColorReference(&refBuffer, clearColor);

			for (vector<int>::const_iterator it = framesOnBuffer.begin(); it != framesOnBuffer.end(); it++)
				m_refRenderer->render(&refBuffer, frameSequence[*it]);

			if (compareToReference(log, refBuffer, currentBuffer, frameNdx, frameNdx-currentBufferAge) == false)
			{
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail, buffer content is not well preserved when age > 0");
				return STOP;
			}
		}
		else // currentBufferAge == 0, content is undefined, clear the buffer, currentBufferAge < 0 is ruled out at the beginning
		{
			clearColorScreen(m_gl, clearColor);
			clearColorReference(&refBuffer, clearColor);
		}

		m_gles2Renderer->render(width, height, newFrame);
		m_refRenderer->render(&refBuffer, newFrame);

		readPixels(m_gl, &currentBuffer);

		if (compareToReference(log, refBuffer, currentBuffer, frameNdx, frameNdx) == false)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail, render result is wrong");
			return STOP;
		}

		if (m_resizeType == RESIZETYPE_BEFORE_SWAP)
		{
			if (frameNdx % 2 == 0)
				m_window->setSurfaceSize(IVec2(width*2, height/2));
			else
				m_window->setSurfaceSize(IVec2(height/2, width*2));
		}

		EGLU_CHECK_CALL(egl, swapBuffers(m_eglDisplay, m_eglSurface));

		if (m_resizeType == RESIZETYPE_AFTER_SWAP)
		{
			if (frameNdx % 2 == 0)
				m_window->setSurfaceSize(IVec2(width*2, height/2));
			else
				m_window->setSurfaceSize(IVec2(height/2, width*2));
		}
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}